

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

DataDeclarationSyntax * __thiscall
slang::parsing::Parser::parseDataDeclaration(Parser *this,AttrList attributes)

{
  group_type_pointer pgVar1;
  undefined4 uVar2;
  uint uVar3;
  undefined2 prev;
  Token semi_00;
  value_type_pointer ppVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  ulong pos0;
  Diagnostic *pDVar9;
  SyntaxNode *this_00;
  SourceLocation location;
  undefined4 extraout_var;
  DataDeclarationSyntax *pDVar10;
  byte bVar11;
  uint uVar12;
  bitmask<slang::parsing::detail::TypeOptions> options;
  ulong hash;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  uchar uVar17;
  uchar uVar19;
  uchar uVar20;
  byte bVar21;
  undefined1 auVar18 [16];
  undefined1 auVar22 [16];
  Token TVar23;
  SourceRange SVar24;
  string_view sVar25;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> sVar26;
  Token t;
  Token lastLifetime;
  locator res;
  SmallVector<slang::parsing::Token,_4UL> modifiers;
  Token semi;
  SmallMap<slang::parsing::TokenKind,_slang::parsing::Token,_4UL,_std::pair<const_slang::parsing::TokenKind,_slang::parsing::Token>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::parsing::TokenKind,_slang::parsing::Token>,_96UL,_16UL>_>
  modifierSet;
  undefined1 local_210 [16];
  undefined1 local_200 [16];
  pointer local_1e8;
  _func_int **local_1d8;
  Info *pIStack_1d0;
  undefined1 local_1c8 [32];
  size_t local_1a8;
  pointer local_1a0;
  __extent_storage<18446744073709551615UL> local_198;
  pointer local_190;
  size_t local_188;
  SmallVectorBase<slang::parsing::Token> local_180 [2];
  Token local_128;
  uchar local_118;
  uchar uStack_117;
  uchar uStack_116;
  byte bStack_115;
  uchar uStack_114;
  uchar uStack_113;
  uchar uStack_112;
  byte bStack_111;
  uchar uStack_110;
  uchar uStack_10f;
  uchar uStack_10e;
  byte bStack_10d;
  uchar uStack_10c;
  uchar uStack_10b;
  uchar uStack_10a;
  byte bStack_109;
  undefined1 local_108 [96];
  undefined1 *local_a8;
  undefined1 *local_a0;
  undefined1 local_98 [24];
  value_type_pointer ppStack_80;
  undefined1 local_78 [16];
  undefined1 local_68 [32];
  EVP_PKEY_CTX *local_48;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> local_40;
  
  local_188 = (size_t)attributes._M_extent._M_extent_value;
  local_190 = attributes._M_ptr;
  local_180[0].data_ = (pointer)local_180[0].firstElement;
  local_180[0].len = 0;
  local_180[0].cap = 4;
  local_a8 = local_108;
  local_98._0_8_ = 0x3f;
  local_98._8_8_ = 1;
  stack0xffffffffffffff78 = ZEXT816(0x5122f0);
  local_78 = (undefined1  [16])0x0;
  local_a0 = local_a8;
  Token::Token((Token *)&local_1d8);
  bVar6 = false;
  bVar7 = false;
  bVar11 = 0;
  bVar16 = false;
LAB_002cc3b3:
  do {
    TVar23 = ParserBase::peek(&this->super_ParserBase);
    bVar5 = slang::syntax::SyntaxFacts::isDeclarationModifier(TVar23.kind);
    if (!bVar5) {
      options.m_bits._1_3_ = 0;
      options.m_bits._0_1_ = bVar11;
      this_00 = (SyntaxNode *)parseDataType(this,options);
      if (this_00->kind == TypeReference && bVar11 == 0) {
        local_1c8._0_16_ = (undefined1  [16])slang::syntax::SyntaxNode::getFirstToken(this_00);
        location = Token::location((Token *)local_1c8);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xaa0005,location);
      }
      Token::Token(&local_128);
      sVar26 = parseDeclarators<&slang::syntax::SyntaxFacts::isNotIdOrComma>
                         (this,Semicolon,&local_128,false,false);
      local_1c8._8_4_ = 1;
      local_1c8._16_16_ = (undefined1  [16])0x0;
      local_1a8 = local_188;
      local_1a0 = local_190;
      local_198._M_extent_value = local_188;
      local_1c8._0_8_ = &PTR_getChild_006d0388;
      iVar8 = SmallVectorBase<slang::parsing::Token>::copy
                        (local_180,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,
                         (EVP_PKEY_CTX *)sVar26._M_extent._M_extent_value._M_extent_value);
      local_1e8 = (pointer)CONCAT44(extraout_var,iVar8);
      local_210._8_4_ = 2;
      local_200 = (undefined1  [16])0x0;
      local_210._0_8_ = &PTR_getChild_006d0988;
      local_68._8_4_ = SeparatedList;
      local_68._16_16_ = (undefined1  [16])0x0;
      local_68._0_8_ = &PTR_getChild_006d0dc0;
      semi_00.info = local_128.info;
      semi_00.kind = local_128.kind;
      semi_00._2_1_ = local_128._2_1_;
      semi_00.numFlags.raw = local_128.numFlags.raw;
      semi_00.rawLen = local_128.rawLen;
      local_48 = (EVP_PKEY_CTX *)sVar26._M_extent._M_extent_value._M_extent_value;
      local_40 = sVar26;
      pDVar10 = slang::syntax::SyntaxFactory::dataDeclaration
                          (&this->factory,
                           (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_1c8,
                           (TokenList *)local_210,(DataTypeSyntax *)this_00,
                           (SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)local_68,semi_00)
      ;
      local_1c8._0_8_ = local_a0;
      if (ppStack_80 != (pair<const_slang::parsing::TokenKind,_slang::parsing::Token> *)0x0) {
        detail::hashing::
        StackAllocator<std::pair<const_slang::parsing::TokenKind,_slang::parsing::Token>,_96UL,_16UL>
        ::deallocate((StackAllocator<std::pair<const_slang::parsing::TokenKind,_slang::parsing::Token>,_96UL,_16UL>
                      *)local_1c8,ppStack_80,(local_98._8_8_ * 0x178 + 0x186U) / 0x18);
      }
      if (local_180[0].data_ != (pointer)local_180[0].firstElement) {
        operator_delete(local_180[0].data_);
      }
      return pDVar10;
    }
    local_210 = (undefined1  [16])ParserBase::consume(&this->super_ParserBase);
    SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
              (local_180,(Token *)local_210);
    auVar18[0] = -(local_210[0] == 'C');
    auVar18[1] = -(local_210[1] == '\x01');
    auVar18[2] = 0xff;
    auVar18[3] = 0xff;
    auVar18[4] = 0xff;
    auVar18[5] = 0xff;
    auVar18[6] = 0xff;
    auVar18[7] = 0xff;
    auVar18[8] = 0xff;
    auVar18[9] = 0xff;
    auVar18[10] = 0xff;
    auVar18[0xb] = 0xff;
    auVar18[0xc] = 0xff;
    auVar18[0xd] = 0xff;
    auVar18[0xe] = 0xff;
    auVar18[0xf] = 0xff;
    if ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) | (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe | 0x8000) == 0xffff) {
      bVar11 = 1;
    }
    hash = SUB168(ZEXT216((ushort)local_210._0_2_) * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(ZEXT216((ushort)local_210._0_2_) * ZEXT816(0x9e3779b97f4a7c15),0);
    pos0 = hash >> (local_98[0] & 0x3f);
    uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[hash & 0xff];
    ppVar4 = ppStack_80;
    uVar15 = 0;
    uVar14 = pos0;
    do {
      pgVar1 = (group_type_pointer)(local_98._16_8_ + uVar14 * 0x10);
      local_118 = pgVar1->m[0].n;
      uStack_117 = pgVar1->m[1].n;
      uStack_116 = pgVar1->m[2].n;
      bStack_115 = pgVar1->m[3].n;
      uStack_114 = pgVar1->m[4].n;
      uStack_113 = pgVar1->m[5].n;
      uStack_112 = pgVar1->m[6].n;
      bStack_111 = pgVar1->m[7].n;
      uStack_110 = pgVar1->m[8].n;
      uStack_10f = pgVar1->m[9].n;
      uStack_10e = pgVar1->m[10].n;
      bStack_10d = pgVar1->m[0xb].n;
      uStack_10c = pgVar1->m[0xc].n;
      uStack_10b = pgVar1->m[0xd].n;
      uStack_10a = pgVar1->m[0xe].n;
      bStack_109 = pgVar1->m[0xf].n;
      uVar17 = (uchar)uVar2;
      auVar22[0] = -(local_118 == uVar17);
      uVar19 = (uchar)((uint)uVar2 >> 8);
      auVar22[1] = -(uStack_117 == uVar19);
      uVar20 = (uchar)((uint)uVar2 >> 0x10);
      auVar22[2] = -(uStack_116 == uVar20);
      bVar21 = (byte)((uint)uVar2 >> 0x18);
      auVar22[3] = -(bStack_115 == bVar21);
      auVar22[4] = -(uStack_114 == uVar17);
      auVar22[5] = -(uStack_113 == uVar19);
      auVar22[6] = -(uStack_112 == uVar20);
      auVar22[7] = -(bStack_111 == bVar21);
      auVar22[8] = -(uStack_110 == uVar17);
      auVar22[9] = -(uStack_10f == uVar19);
      auVar22[10] = -(uStack_10e == uVar20);
      auVar22[0xb] = -(bStack_10d == bVar21);
      auVar22[0xc] = -(uStack_10c == uVar17);
      auVar22[0xd] = -(uStack_10b == uVar19);
      auVar22[0xe] = -(uStack_10a == uVar20);
      auVar22[0xf] = -(bStack_109 == bVar21);
      for (uVar12 = (uint)(ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe); uVar12 != 0;
          uVar12 = uVar12 - 1 & uVar12) {
        uVar3 = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
          }
        }
        if (local_210._0_2_ == ppStack_80[uVar14 * 0xf + (ulong)uVar3].first) {
          bVar5 = !bVar16;
          bVar16 = true;
          if (bVar5) {
            SVar24 = Token::range((Token *)local_210);
            pDVar9 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x260005,SVar24);
            sVar25 = Token::rawText((Token *)local_210);
            pDVar9 = Diagnostic::operator<<(pDVar9,sVar25);
            SVar24 = Token::range(&ppVar4[uVar14 * 0xf + (ulong)uVar3].second);
            Diagnostic::operator<<(pDVar9,SVar24);
          }
          goto LAB_002cc3b3;
        }
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bStack_109) == 0) break;
      lVar13 = uVar14 + uVar15;
      uVar15 = uVar15 + 1;
      uVar14 = lVar13 + 1U & local_98._8_8_;
    } while (uVar15 <= (ulong)local_98._8_8_);
    if ((ulong)local_78._8_8_ < (ulong)local_78._0_8_) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,slang::parsing::Token>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,slang::detail::hashing::StackAllocator<std::pair<slang::parsing::TokenKind_const,slang::parsing::Token>,96ul,16ul>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind&,slang::parsing::Token&>
                ((locator *)local_1c8,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,slang::parsing::Token>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,slang::detail::hashing::StackAllocator<std::pair<slang::parsing::TokenKind_const,slang::parsing::Token>,96ul,16ul>>
                  *)&local_a0,(arrays_type *)local_98,pos0,hash,(try_emplace_args_t *)local_68,
                 (TokenKind *)local_210,(Token *)local_210);
      local_78._8_8_ = local_78._8_8_ + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,slang::parsing::Token>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,slang::detail::hashing::StackAllocator<std::pair<slang::parsing::TokenKind_const,slang::parsing::Token>,96ul,16ul>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind&,slang::parsing::Token&>
                ((locator *)local_1c8,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,slang::parsing::Token>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,slang::detail::hashing::StackAllocator<std::pair<slang::parsing::TokenKind_const,slang::parsing::Token>,96ul,16ul>>
                  *)&local_a0,hash,(try_emplace_args_t *)local_68,(TokenKind *)local_210,
                 (Token *)local_210);
    }
    bVar5 = slang::syntax::SyntaxFacts::isLifetimeModifier(local_210._0_2_);
    if (bVar5) {
      if (pIStack_1d0 != (Info *)0x0) {
        if (bVar7) {
          bVar7 = true;
        }
        else {
          SVar24 = Token::range((Token *)local_210);
          pDVar9 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x170005,SVar24);
          sVar25 = Token::rawText((Token *)local_210);
          Diagnostic::operator<<(pDVar9,sVar25);
          sVar25 = Token::rawText((Token *)&local_1d8);
          pDVar9 = Diagnostic::operator<<(pDVar9,sVar25);
          SVar24 = Token::range((Token *)&local_1d8);
          Diagnostic::operator<<(pDVar9,SVar24);
          bVar7 = true;
        }
        goto LAB_002cc3b3;
      }
      local_1d8 = (_func_int **)local_210._0_8_;
      pIStack_1d0 = (Info *)local_210._8_8_;
    }
    if (bVar6) {
      bVar6 = true;
    }
    else if (local_180[0].len < 2) {
      bVar6 = false;
    }
    else {
      prev = local_180[0].data_[local_180[0].len - 2].kind;
      local_1c8._0_16_ = *(undefined1 (*) [16])(local_180[0].data_ + (local_180[0].len - 2));
      bVar6 = slang::syntax::SyntaxFacts::isModifierAllowedAfter(local_210._0_2_,prev);
      if (!bVar6) {
        SVar24 = Token::range((Token *)local_210);
        pDVar9 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x180005,SVar24);
        sVar25 = Token::rawText((Token *)local_210);
        Diagnostic::operator<<(pDVar9,sVar25);
        sVar25 = Token::rawText((Token *)local_1c8);
        pDVar9 = Diagnostic::operator<<(pDVar9,sVar25);
        SVar24 = Token::range((Token *)local_1c8);
        Diagnostic::operator<<(pDVar9,SVar24);
      }
      bVar6 = !bVar6;
    }
  } while( true );
}

Assistant:

DataDeclarationSyntax& Parser::parseDataDeclaration(AttrList attributes) {
    SmallVector<Token, 4> modifiers;
    SmallMap<TokenKind, Token, 4> modifierSet;
    Token lastLifetime;
    bool hasVar = false;
    bool errorDup = false;
    bool errorLifetime = false;
    bool errorOrdering = false;

    while (isDeclarationModifier(peek().kind)) {
        Token t = consume();
        modifiers.push_back(t);
        if (t.kind == TokenKind::VarKeyword)
            hasVar = true;

        if (auto [it, inserted] = modifierSet.emplace(t.kind, t); !inserted) {
            if (!errorDup) {
                auto& diag = addDiag(diag::DuplicateDeclModifier, t.range());
                diag << t.rawText() << it->second.range();
                errorDup = true;
            }
            continue;
        }

        if (SyntaxFacts::isLifetimeModifier(t.kind)) {
            if (lastLifetime) {
                if (!errorLifetime) {
                    auto& diag = addDiag(diag::DeclModifierConflict, t.range());
                    diag << t.rawText();
                    diag << lastLifetime.rawText() << lastLifetime.range();
                    errorLifetime = true;
                }
                continue;
            }
            lastLifetime = t;
        }

        if (!errorOrdering && modifiers.size() > 1) {
            Token prev = modifiers[modifiers.size() - 2];
            if (!SyntaxFacts::isModifierAllowedAfter(t.kind, prev.kind)) {
                auto& diag = addDiag(diag::DeclModifierOrdering, t.range());
                diag << t.rawText();
                diag << prev.rawText() << prev.range();
                errorOrdering = true;
            }
        }
    }

    auto& dataType = parseDataType(hasVar ? TypeOptions::AllowImplicit : TypeOptions::None);
    if (dataType.kind == SyntaxKind::TypeReference && !hasVar)
        addDiag(diag::TypeRefDeclVar, dataType.getFirstToken().location());

    Token semi;
    auto declarators = parseDeclarators(semi);

    return factory.dataDeclaration(attributes, modifiers.copy(alloc), dataType, declarators, semi);
}